

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O0

void __thiscall KVStore::put(KVStore *this,uint64_t key,string *value)

{
  int __val;
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  char *__path;
  SSTableCache *this_00;
  uint uVar5;
  __mode_t __mode;
  string local_118 [32];
  SSTableCache *local_f8;
  __cxx11 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [40];
  string *value_local;
  uint64_t key_local;
  KVStore *this_local;
  uint64_t uVar6;
  string *__rhs;
  
  local_40._32_8_ = value;
  value_local = (string *)key;
  key_local = (uint64_t)this;
  uVar2 = SkipList::getLength(&this->memTable);
  uVar3 = SkipList::getValueSize(&this->memTable);
  lVar4 = std::__cxx11::string::size();
  bVar1 = overflow(uVar2 + 1,uVar3 + lVar4);
  if (bVar1) {
    std::operator+(local_40,(char *)&this->storagePath);
    bVar1 = utils::dirExists(local_40);
    std::__cxx11::string::~string((string *)local_40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __rhs = &this->storagePath;
      std::operator+(local_70,(char *)__rhs);
      __mode = (__mode_t)__rhs;
      __path = (char *)std::__cxx11::string::c_str();
      utils::mkdir(__path,__mode);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::operator+(local_d0,(char *)&this->storagePath);
    __val = this->fileNums;
    uVar5 = __val + 1;
    uVar6 = (uint64_t)uVar5;
    this->fileNums = uVar5;
    std::__cxx11::to_string(local_f0,__val);
    std::operator+(local_b0,local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (char *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_d0);
    SSTable::toSSTable((SSTable *)&this->memTable,(SkipList *)local_90,(string *)this->timeStamp,
                       uVar6);
    this_00 = (SSTableCache *)operator_new(0x2858);
    uVar6 = this->timeStamp;
    std::__cxx11::string::string(local_118,(string *)local_90);
    SSTableCache::SSTableCache(this_00,&this->memTable,uVar6,(string *)local_118);
    local_f8 = this_00;
    std::
    map<std::__cxx11::string,SSTableCache*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
    ::emplace<std::__cxx11::string&,SSTableCache*>
              ((map<std::__cxx11::string,SSTableCache*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                *)&this->cache,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               &local_f8);
    std::__cxx11::string::~string(local_118);
    this->timeStamp = this->timeStamp + 1;
    SkipList::reset(&this->memTable);
    compaction(this,0);
    std::__cxx11::string::~string((string *)local_90);
  }
  SkipList::put(&this->memTable,(uint64_t)value_local,(string *)local_40._32_8_);
  return;
}

Assistant:

void KVStore::put(uint64_t key, const string &value) {
  // if overflow, convert memTable to a SSTable and do compaction
  if (overflow(memTable.getLength() + 1,
               memTable.getValueSize() + value.size())) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());

    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    timeStamp++;

    memTable.reset();

    compaction(0);
  }
  memTable.put(key, value);
}